

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall wabt::interp::Thread::DoTableCopy(Thread *this,Instr instr,Ptr *out_trap)

{
  Result RVar1;
  RunResult RVar2;
  Store *pSVar3;
  Value VVar4;
  Value VVar5;
  Value VVar6;
  allocator local_99;
  Ptr table_src;
  Ptr table_dst;
  Ptr local_68;
  string local_50;
  
  RefPtr<wabt::interp::Table>::RefPtr
            (&table_dst,this->store_,
             (Ref)(this->inst_->tables_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  RefPtr<wabt::interp::Table>::RefPtr
            (&table_src,this->store_,
             (Ref)(this->inst_->tables_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32x2.snd].index);
  VVar4 = Pop(this);
  VVar5 = Pop(this);
  pSVar3 = (Store *)this;
  VVar6 = Pop(this);
  RVar1 = Table::Copy(pSVar3,table_dst.obj_,VVar6.i32_,table_src.obj_,VVar5.i32_,VVar4.i32_);
  RVar2 = Ok;
  if (RVar1.enum_ == Error) {
    pSVar3 = this->store_;
    std::__cxx11::string::string
              ((string *)&local_50,"out of bounds table access: table.copy out of bounds",&local_99)
    ;
    Trap::New(&local_68,pSVar3,&local_50,&this->frames_);
    out_trap->obj_ = local_68.obj_;
    out_trap->store_ = local_68.store_;
    out_trap->root_index_ = local_68.root_index_;
    local_68.obj_ = (Trap *)0x0;
    local_68.store_ = (Store *)0x0;
    local_68.root_index_ = 0;
    RefPtr<wabt::interp::Trap>::reset(&local_68);
    std::__cxx11::string::_M_dispose();
    RVar2 = Trap;
  }
  RefPtr<wabt::interp::Table>::reset(&table_src);
  RefPtr<wabt::interp::Table>::reset(&table_dst);
  return RVar2;
}

Assistant:

RunResult Thread::DoTableCopy(Instr instr, Trap::Ptr* out_trap) {
  Table::Ptr table_dst{store_, inst_->tables()[instr.imm_u32x2.fst]};
  Table::Ptr table_src{store_, inst_->tables()[instr.imm_u32x2.snd]};
  auto size = Pop<u32>();
  auto src = Pop<u32>();
  auto dst = Pop<u32>();
  TRAP_IF(Failed(Table::Copy(store_, *table_dst, dst, *table_src, src, size)),
          "out of bounds table access: table.copy out of bounds");
  return RunResult::Ok;
}